

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O0

int add_cert_bag(CBB *cbb,X509 *cert,char *name,uint8_t *key_id,size_t key_id_len)

{
  int iVar1;
  size_t local_148;
  size_t name_len;
  char *cert_name;
  int int_name_len;
  int len;
  uint8_t *buf;
  CBB cert_value;
  CBB wrapped_cert;
  CBB cert_bag;
  CBB bag_contents;
  CBB bag;
  size_t key_id_len_local;
  uint8_t *key_id_local;
  char *name_local;
  X509 *cert_local;
  CBB *cbb_local;
  
  iVar1 = CBB_add_asn1(cbb,(CBB *)((long)&bag_contents.u + 0x18),0x20000010);
  if (((((iVar1 == 0) ||
        (iVar1 = CBB_add_asn1_element((CBB *)((long)&bag_contents.u + 0x18),6,kCertBag,0xb),
        iVar1 == 0)) ||
       (iVar1 = CBB_add_asn1((CBB *)((long)&bag_contents.u + 0x18),(CBB *)((long)&cert_bag.u + 0x18)
                             ,0xa0000000), iVar1 == 0)) ||
      ((iVar1 = CBB_add_asn1((CBB *)((long)&cert_bag.u + 0x18),(CBB *)((long)&wrapped_cert.u + 0x18)
                             ,0x20000010), iVar1 == 0 ||
       (iVar1 = CBB_add_asn1_element((CBB *)((long)&wrapped_cert.u + 0x18),6,kX509Certificate,10),
       iVar1 == 0)))) ||
     ((iVar1 = CBB_add_asn1((CBB *)((long)&wrapped_cert.u + 0x18),
                            (CBB *)((long)&cert_value.u + 0x18),0xa0000000), iVar1 == 0 ||
      (iVar1 = CBB_add_asn1((CBB *)((long)&cert_value.u + 0x18),(CBB *)&buf,4), iVar1 == 0)))) {
    cbb_local._4_4_ = 0;
  }
  else {
    cert_name._4_4_ = i2d_X509(cert,(uint8_t **)0x0);
    cert_name._0_4_ = 0;
    key_id_local = X509_alias_get0((X509 *)cert,(int *)&cert_name);
    local_148 = (size_t)(int)cert_name;
    if (name != (char *)0x0) {
      if (local_148 != 0) {
        ERR_put_error(0x13,0,0x85,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x3ca);
        return 0;
      }
      local_148 = strlen(name);
      key_id_local = (uint8_t *)name;
    }
    if (((cert_name._4_4_ < 0) ||
        (iVar1 = CBB_add_space((CBB *)&buf,(uint8_t **)&int_name_len,(long)cert_name._4_4_),
        iVar1 == 0)) ||
       ((iVar1 = i2d_X509(cert,(uint8_t **)&int_name_len), iVar1 < 0 ||
        ((iVar1 = add_bag_attributes((CBB *)((long)&bag_contents.u + 0x18),(char *)key_id_local,
                                     local_148,key_id,key_id_len), iVar1 == 0 ||
         (iVar1 = CBB_flush(cbb), iVar1 == 0)))))) {
      cbb_local._4_4_ = 0;
    }
    else {
      cbb_local._4_4_ = 1;
    }
  }
  return cbb_local._4_4_;
}

Assistant:

static int add_cert_bag(CBB *cbb, X509 *cert, const char *name,
                        const uint8_t *key_id, size_t key_id_len) {
  CBB bag, bag_contents, cert_bag, wrapped_cert, cert_value;
  if (  // See https://tools.ietf.org/html/rfc7292#section-4.2.
      !CBB_add_asn1(cbb, &bag, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kCertBag,
                            sizeof(kCertBag)) ||
      !CBB_add_asn1(&bag, &bag_contents,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      // See https://tools.ietf.org/html/rfc7292#section-4.2.3.
      !CBB_add_asn1(&bag_contents, &cert_bag, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&cert_bag, CBS_ASN1_OBJECT, kX509Certificate,
                            sizeof(kX509Certificate)) ||
      !CBB_add_asn1(&cert_bag, &wrapped_cert,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      !CBB_add_asn1(&wrapped_cert, &cert_value, CBS_ASN1_OCTETSTRING)) {
    return 0;
  }
  uint8_t *buf;
  int len = i2d_X509(cert, NULL);

  int int_name_len = 0;
  const char *cert_name = (const char *)X509_alias_get0(cert, &int_name_len);
  size_t name_len = int_name_len;
  if (name) {
    if (name_len != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_AMBIGUOUS_FRIENDLY_NAME);
      return 0;
    }
    name_len = strlen(name);
  } else {
    name = cert_name;
  }

  if (len < 0 || !CBB_add_space(&cert_value, &buf, (size_t)len) ||
      i2d_X509(cert, &buf) < 0 ||
      !add_bag_attributes(&bag, name, name_len, key_id, key_id_len) ||
      !CBB_flush(cbb)) {
    return 0;
  }
  return 1;
}